

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeSignedLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  ulong Val;
  bool bVar6;
  
  uVar4 = insn >> 5 & 0x1f;
  uVar1 = insn >> 0xc & 0x1ff;
  Val = (ulong)uVar1 - 0x200;
  if (uVar1 < 0x100) {
    Val = (ulong)uVar1;
  }
  uVar1 = MCInst_getOpcode(Inst);
  if ((((uVar1 - 0x3c6 < 0x3d) &&
       ((0x18618c6318631863U >> ((ulong)(uVar1 - 0x3c6) & 0x3f) & 1) != 0)) ||
      ((uVar1 - 0x757 < 0x2a && ((0x318c6318c63U >> ((ulong)(uVar1 - 0x757) & 0x3f) & 1) != 0)))) ||
     ((uVar1 - 0x407 < 8 && ((0xc3U >> (uVar1 - 0x407 & 0x1f) & 1) != 0)))) {
    uVar1 = 4;
    if (uVar4 != 0x1f) {
      uVar1 = GPR64DecoderTable[uVar4];
    }
    MCOperand_CreateReg0(Inst,uVar1);
  }
  uVar5 = insn & 0x1f;
  uVar1 = MCInst_getOpcode(Inst);
  DVar2 = MCDisassembler_Fail;
  switch(uVar1) {
  case 0x3c6:
  case 0x3c7:
  case 0x3d6:
  case 0x3d7:
  case 0x3e6:
  case 999:
  case 0x3f0:
  case 0x3f1:
  case 0x407:
  case 0x408:
  case 0x412:
  case 0x413:
  case 0x414:
  case 0x416:
  case 0x419:
  case 0x41b:
  case 0x41e:
  case 0x421:
  case 0x423:
  case 0x427:
switchD_001ffc0f_caseD_3c6:
    puVar3 = GPR32DecoderTable;
    break;
  case 0x3c8:
  case 0x3c9:
  case 0x3ca:
  case 0x3cd:
  case 0x3ce:
  case 0x3cf:
  case 0x3d0:
  case 0x3d3:
  case 0x3d4:
  case 0x3d5:
  case 0x3d8:
  case 0x3d9:
  case 0x3da:
  case 0x3dd:
  case 0x3de:
  case 0x3df:
  case 0x3e0:
  case 0x3e3:
  case 0x3e4:
  case 0x3e5:
  case 1000:
  case 0x3e9:
  case 0x3ea:
  case 0x3ed:
  case 0x3ee:
  case 0x3ef:
  case 0x3f2:
  case 0x3f3:
  case 0x3f4:
  case 0x3f7:
  case 0x3f8:
  case 0x3f9:
  case 0x3fa:
  case 0x3fd:
  case 0x3fe:
  case 0x3ff:
  case 0x400:
  case 0x403:
  case 0x404:
  case 0x405:
  case 0x406:
  case 0x409:
  case 0x40a:
  case 0x40b:
  case 0x40c:
  case 0x40f:
  case 0x410:
  case 0x411:
    goto switchD_001ffc0f_caseD_3c8;
  case 0x3cb:
  case 0x3cc:
  case 0x41c:
switchD_001ffc0f_caseD_3cb:
    puVar3 = FPR8DecoderTable;
    break;
  case 0x3d1:
  case 0x3d2:
  case 0x41d:
switchD_001ffc0f_caseD_3d1:
    puVar3 = FPR64DecoderTable;
    break;
  case 0x3db:
  case 0x3dc:
  case 0x41f:
switchD_001ffc0f_caseD_3db:
    puVar3 = FPR16DecoderTable;
    break;
  case 0x3e1:
  case 0x3e2:
  case 0x420:
switchD_001ffc0f_caseD_3e1:
    puVar3 = FPR128DecoderTable;
    break;
  case 0x3eb:
  case 0x3ec:
  case 0x3f5:
  case 0x3f6:
  case 0x3fb:
  case 0x3fc:
  case 0x40d:
  case 0x40e:
  case 0x415:
  case 0x417:
  case 0x418:
  case 0x41a:
  case 0x422:
  case 0x424:
  case 0x425:
  case 0x428:
switchD_001ffc0f_caseD_3eb:
    puVar3 = GPR64DecoderTable;
    break;
  case 0x401:
  case 0x402:
  case 0x426:
switchD_001ffc0f_caseD_401:
    puVar3 = FPR32DecoderTable;
    break;
  default:
    switch(uVar1) {
    case 0x757:
    case 0x758:
    case 0x766:
    case 0x767:
    case 0x77a:
    case 0x77b:
    case 0x784:
    case 0x785:
    case 0x786:
    case 0x788:
    case 0x78b:
    case 0x78f:
      goto switchD_001ffc0f_caseD_3c6;
    case 0x759:
    case 0x75a:
    case 0x75b:
    case 0x75e:
    case 0x75f:
    case 0x760:
    case 0x763:
    case 0x764:
    case 0x765:
    case 0x768:
    case 0x769:
    case 0x76a:
    case 0x76d:
    case 0x76e:
    case 0x76f:
    case 0x772:
    case 0x773:
    case 0x774:
    case 0x777:
    case 0x778:
    case 0x779:
    case 0x77c:
    case 0x77d:
    case 0x77e:
    case 0x781:
    case 0x782:
    case 0x783:
      goto switchD_001ffc0f_caseD_3c8;
    case 0x75c:
    case 0x75d:
    case 0x789:
      goto switchD_001ffc0f_caseD_3cb;
    case 0x761:
    case 0x762:
    case 0x78a:
      goto switchD_001ffc0f_caseD_3d1;
    case 0x76b:
    case 0x76c:
    case 0x78c:
      goto switchD_001ffc0f_caseD_3db;
    case 0x770:
    case 0x771:
    case 0x78d:
      goto switchD_001ffc0f_caseD_3e1;
    case 0x775:
    case 0x776:
    case 0x78e:
      goto switchD_001ffc0f_caseD_401;
    case 0x77f:
    case 0x780:
    case 0x787:
    case 0x790:
      goto switchD_001ffc0f_caseD_3eb;
    default:
      if (uVar1 != 0x49d) {
        return MCDisassembler_Fail;
      }
      MCOperand_CreateImm0(Inst,(ulong)uVar5);
    }
    goto LAB_001ffc51;
  }
  MCOperand_CreateReg0(Inst,puVar3[uVar5]);
LAB_001ffc51:
  uVar1 = 4;
  bVar6 = uVar4 == 0x1f;
  if (!bVar6) {
    uVar1 = GPR64DecoderTable[uVar4];
  }
  MCOperand_CreateReg0(Inst,uVar1);
  MCOperand_CreateImm0(Inst,Val);
  DVar2 = bVar6 + 1 + (uint)bVar6;
  if ((insn >> 0x1a & 1) != 0) {
    DVar2 = MCDisassembler_Success;
  }
  if ((insn & 0xc00) == 0) {
    DVar2 = MCDisassembler_Success;
  }
  if ((insn & 0x400000) == 0) {
    DVar2 = MCDisassembler_Success;
  }
  if (uVar5 != uVar4) {
    DVar2 = MCDisassembler_Success;
  }
switchD_001ffc0f_caseD_3c8:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeSignedLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	bool IsLoad;
	bool IsIndexed;
	bool IsFP;
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	int64_t offset = fieldFromInstruction(insn, 12, 9);

	// offset is a 9-bit signed immediate, so sign extend it to
	// fill the unsigned.
	if (offset & (1 << (9 - 1)))
		offset |= ~((1LL << 9) - 1);

	// First operand is always the writeback to the address register, if needed.
	switch (MCInst_getOpcode(Inst)) {
		default:
			break;
		case AArch64_LDRSBWpre:
		case AArch64_LDRSHWpre:
		case AArch64_STRBBpre:
		case AArch64_LDRBBpre:
		case AArch64_STRHHpre:
		case AArch64_LDRHHpre:
		case AArch64_STRWpre:
		case AArch64_LDRWpre:
		case AArch64_LDRSBWpost:
		case AArch64_LDRSHWpost:
		case AArch64_STRBBpost:
		case AArch64_LDRBBpost:
		case AArch64_STRHHpost:
		case AArch64_LDRHHpost:
		case AArch64_STRWpost:
		case AArch64_LDRWpost:
		case AArch64_LDRSBXpre:
		case AArch64_LDRSHXpre:
		case AArch64_STRXpre:
		case AArch64_LDRSWpre:
		case AArch64_LDRXpre:
		case AArch64_LDRSBXpost:
		case AArch64_LDRSHXpost:
		case AArch64_STRXpost:
		case AArch64_LDRSWpost:
		case AArch64_LDRXpost:
		case AArch64_LDRQpre:
		case AArch64_STRQpre:
		case AArch64_LDRQpost:
		case AArch64_STRQpost:
		case AArch64_LDRDpre:
		case AArch64_STRDpre:
		case AArch64_LDRDpost:
		case AArch64_STRDpost:
		case AArch64_LDRSpre:
		case AArch64_STRSpre:
		case AArch64_LDRSpost:
		case AArch64_STRSpost:
		case AArch64_LDRHpre:
		case AArch64_STRHpre:
		case AArch64_LDRHpost:
		case AArch64_STRHpost:
		case AArch64_LDRBpre:
		case AArch64_STRBpre:
		case AArch64_LDRBpost:
		case AArch64_STRBpost:
			DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_PRFUMi:
			// Rt is an immediate in prefetch.
			MCOperand_CreateImm0(Inst, Rt);
			break;
		case AArch64_STURBBi:
		case AArch64_LDURBBi:
		case AArch64_LDURSBWi:
		case AArch64_STURHHi:
		case AArch64_LDURHHi:
		case AArch64_LDURSHWi:
		case AArch64_STURWi:
		case AArch64_LDURWi:
		case AArch64_LDTRSBWi:
		case AArch64_LDTRSHWi:
		case AArch64_STTRWi:
		case AArch64_LDTRWi:
		case AArch64_STTRHi:
		case AArch64_LDTRHi:
		case AArch64_LDTRBi:
		case AArch64_STTRBi:
		case AArch64_LDRSBWpre:
		case AArch64_LDRSHWpre:
		case AArch64_STRBBpre:
		case AArch64_LDRBBpre:
		case AArch64_STRHHpre:
		case AArch64_LDRHHpre:
		case AArch64_STRWpre:
		case AArch64_LDRWpre:
		case AArch64_LDRSBWpost:
		case AArch64_LDRSHWpost:
		case AArch64_STRBBpost:
		case AArch64_LDRBBpost:
		case AArch64_STRHHpost:
		case AArch64_LDRHHpost:
		case AArch64_STRWpost:
		case AArch64_LDRWpost:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURSBXi:
		case AArch64_LDURSHXi:
		case AArch64_LDURSWi:
		case AArch64_STURXi:
		case AArch64_LDURXi:
		case AArch64_LDTRSBXi:
		case AArch64_LDTRSHXi:
		case AArch64_LDTRSWi:
		case AArch64_STTRXi:
		case AArch64_LDTRXi:
		case AArch64_LDRSBXpre:
		case AArch64_LDRSHXpre:
		case AArch64_STRXpre:
		case AArch64_LDRSWpre:
		case AArch64_LDRXpre:
		case AArch64_LDRSBXpost:
		case AArch64_LDRSHXpost:
		case AArch64_STRXpost:
		case AArch64_LDRSWpost:
		case AArch64_LDRXpost:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURQi:
		case AArch64_STURQi:
		case AArch64_LDRQpre:
		case AArch64_STRQpre:
		case AArch64_LDRQpost:
		case AArch64_STRQpost:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURDi:
		case AArch64_STURDi:
		case AArch64_LDRDpre:
		case AArch64_STRDpre:
		case AArch64_LDRDpost:
		case AArch64_STRDpost:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURSi:
		case AArch64_STURSi:
		case AArch64_LDRSpre:
		case AArch64_STRSpre:
		case AArch64_LDRSpost:
		case AArch64_STRSpost:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURHi:
		case AArch64_STURHi:
		case AArch64_LDRHpre:
		case AArch64_STRHpre:
		case AArch64_LDRHpost:
		case AArch64_STRHpost:
			DecodeFPR16RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURBi:
		case AArch64_STURBi:
		case AArch64_LDRBpre:
		case AArch64_STRBpre:
		case AArch64_LDRBpost:
		case AArch64_STRBpost:
			DecodeFPR8RegisterClass(Inst, Rt, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	MCOperand_CreateImm0(Inst, offset);

	IsLoad = fieldFromInstruction(insn, 22, 1) != 0;
	IsIndexed = fieldFromInstruction(insn, 10, 2) != 0;
	IsFP = fieldFromInstruction(insn, 26, 1) != 0;

	// Cannot write back to a transfer register (but xzr != sp).
	if (IsLoad && IsIndexed && !IsFP && Rn != 31 && Rt == Rn)
		return SoftFail;

	return Success;
}